

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O1

void object_kind_name(char *buf,size_t max,object_kind *kind,_Bool easy_know)

{
  undefined7 in_register_00000009;
  
  if ((((int)CONCAT71(in_register_00000009,easy_know) == 0) && (kind->aware == false)) &&
     (kind->flavor != (flavor *)0x0)) {
    my_strcpy(buf,kind->flavor->text,max);
    return;
  }
  obj_desc_name_format(buf,max,0,kind->name,(char *)0x0,false);
  return;
}

Assistant:

void object_kind_name(char *buf, size_t max, const struct object_kind *kind,
					  bool easy_know)
{
	/* If not aware, the plain flavour (e.g. Copper) will do. */
	if (!easy_know && !kind->aware && kind->flavor)
		my_strcpy(buf, kind->flavor->text, max);

	/* Use proper name (Healing, or whatever) */
	else
		(void) obj_desc_name_format(buf, max, 0, kind->name, NULL, false);
}